

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  pointer pnVar6;
  pointer pIVar7;
  undefined8 uVar8;
  int *piVar9;
  IdxElement *keys;
  type_conflict5 tVar10;
  uint uVar11;
  DataKey DVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  ulong uVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  value_type local_124;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar6 = (pSVar4->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b8.m_backend.fpclass = cpp_dec_float_finite;
  local_1b8.m_backend.prec_elem = 10;
  local_1b8.m_backend.data._M_elems[0] = 0;
  local_1b8.m_backend.data._M_elems[1] = 0;
  local_1b8.m_backend.data._M_elems[2] = 0;
  local_1b8.m_backend.data._M_elems[3] = 0;
  local_1b8.m_backend.data._M_elems[4] = 0;
  local_1b8.m_backend.data._M_elems[5] = 0;
  local_1b8.m_backend.data._M_elems._24_5_ = 0;
  local_1b8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_1b8.m_backend.data._M_elems._32_5_ = 0;
  local_1b8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_1b8.m_backend.exp = 0;
  local_1b8.m_backend.neg = false;
  local_124.val.m_backend.fpclass = cpp_dec_float_finite;
  local_124.val.m_backend.prec_elem = 10;
  local_124.val.m_backend.data._M_elems[0] = 0;
  local_124.val.m_backend.data._M_elems[1] = 0;
  local_124.val.m_backend.data._M_elems[2] = 0;
  local_124.val.m_backend.data._M_elems[3] = 0;
  local_124.val.m_backend.data._M_elems[4] = 0;
  local_124.val.m_backend.data._M_elems[5] = 0;
  local_124.val.m_backend.data._M_elems._24_5_ = 0;
  local_124.val.m_backend.data._M_elems[7]._1_3_ = 0;
  local_124.val.m_backend.data._M_elems._32_5_ = 0;
  local_124.val.m_backend.data._M_elems[9]._1_3_ = 0;
  local_124.val.m_backend.exp = 0;
  local_124.val.m_backend.neg = false;
  pIVar7 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pricesCo).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar7) {
    (this->pricesCo).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  (this->bestPricesCo).super_IdxSet.num = 0;
  for (uVar13 = (ulong)(uint)(pSVar4->infeasibilitiesCo).super_IdxSet.num; 0 < (int)uVar13;
      uVar13 = uVar13 - 1) {
    iVar2 = (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[uVar13 - 1];
    uVar8 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_1b8.m_backend.data._M_elems._32_5_ = SUB85(uVar8,0);
    local_1b8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_1b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_1b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_1b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar8 = *(undefined8 *)(puVar1 + 2);
    local_1b8.m_backend.data._M_elems._24_5_ = SUB85(uVar8,0);
    local_1b8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_1b8.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_1b8.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_1b8.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_1b8.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar10 = boost::multiprecision::operator<(&local_1b8,&result);
    pSVar4 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (tVar10) {
      (pSVar4->isInfeasibleCo).data[iVar2] = 1;
      uStack_50 = CONCAT35(local_1b8.m_backend.data._M_elems[7]._1_3_,
                           local_1b8.m_backend.data._M_elems._24_5_);
      local_68 = (steeppr  [8])local_1b8.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_1b8.m_backend.data._M_elems[2];
      auStack_60[1] = local_1b8.m_backend.data._M_elems[3];
      local_58[0] = local_1b8.m_backend.data._M_elems[4];
      local_58[1] = local_1b8.m_backend.data._M_elems[5];
      local_48 = CONCAT35(local_1b8.m_backend.data._M_elems[9]._1_3_,
                          local_1b8.m_backend.data._M_elems._32_5_);
      local_40 = local_1b8.m_backend.exp;
      local_3c = local_1b8.m_backend.neg;
      local_38 = local_1b8.m_backend.fpclass;
      iStack_34 = local_1b8.m_backend.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar2].m_backend.data;
      local_a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar6[iVar2].m_backend.data + 0x10);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar6[iVar2].m_backend.data + 0x20);
      local_a8.m_backend.exp = pnVar6[iVar2].m_backend.exp;
      local_a8.m_backend.neg = pnVar6[iVar2].m_backend.neg;
      local_a8.m_backend.fpclass = pnVar6[iVar2].m_backend.fpclass;
      local_a8.m_backend.prec_elem = pnVar6[iVar2].m_backend.prec_elem;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (feastol->m_backend).exp;
      local_e8.m_backend.neg = (feastol->m_backend).neg;
      local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_68,&local_a8,&local_e8,in_R8);
      local_124.val.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_124.val.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_124.val.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_124.val.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_124.val.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_124.val.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_124.val.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_124.val.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_124.val.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_124.val.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_124.val.m_backend.exp = result.m_backend.exp;
      local_124.val.m_backend.neg = result.m_backend.neg;
      local_124.val.m_backend.fpclass = result.m_backend.fpclass;
      local_124.val.m_backend.prec_elem = result.m_backend.prec_elem;
      local_124.idx = iVar2;
      std::
      vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ::push_back(&(this->pricesCo).data,&local_124);
    }
    else {
      piVar9 = (pSVar4->infeasibilitiesCo).super_IdxSet.idx;
      iVar3 = (pSVar4->infeasibilitiesCo).super_IdxSet.num;
      (pSVar4->infeasibilitiesCo).super_IdxSet.num = iVar3 + -1;
      piVar9[uVar13 - 1] = piVar9[(long)iVar3 + -1];
      (pSVar4->isInfeasibleCo).data[iVar2] = 0;
    }
  }
  keys = (this->pricesCo).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  lVar14 = 0;
  uVar11 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,&(this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).compare,0,(int)(((long)pIVar7 - (long)keys) / 0x3c),100,0,0,true);
  uVar13 = 0;
  if (0 < (int)uVar11) {
    uVar13 = (ulong)uVar11;
  }
  for (; uVar13 * 0x3c - lVar14 != 0; lVar14 = lVar14 + 0x3c) {
    DIdxSet::addIdx(&this->bestPricesCo,
                    *(int *)((long)&(((this->pricesCo).data.
                                      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                            lVar14 + -4));
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasibleCo).data
    [*(int *)((long)&(((this->pricesCo).data.
                       super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar14 + -4)] =
         2;
  }
  if ((int)uVar11 < 1) {
    DVar12.info = 0;
    DVar12.idx = -1;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&best->m_backend,
               &(((this->pricesCo).data.
                  super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                  ._M_impl.super__Vector_impl_data._M_start)->val).m_backend);
    DVar12 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,
                           ((this->pricesCo).data.
                            super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                            ._M_impl.super__Vector_impl_data._M_start)->idx);
  }
  return (SPxId)DVar12;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, weights_ptr[idx], feastol);
         price.idx = idx;
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}